

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O3

int run_test_getaddrinfo_concurrent(void)

{
  int iVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  long extraout_RDX_00;
  uv_getaddrinfo_t *puVar5;
  size_t *psVar6;
  undefined8 *puVar7;
  int *piVar8;
  long lVar9;
  
  puVar5 = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  do {
    *piVar8 = 0;
    puVar7 = (undefined8 *)0x4;
    puVar2 = (undefined4 *)malloc(4);
    if (puVar2 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b8bc:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b8c1;
    }
    *puVar2 = (int)lVar9;
    puVar5->data = puVar2;
    puVar7 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar7,puVar5,getaddrinfo_cuncurrent_cb,"localhost",0,0);
    if (iVar1 != 0) goto LAB_0015b8bc;
    lVar9 = lVar9 + 1;
    puVar5 = puVar5 + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puVar7 = (undefined8 *)uv_default_loop();
  lVar9 = 0;
  uv_run(puVar7,0);
  do {
    if (*(int *)((long)callback_counts + lVar9) != 1) goto LAB_0015b8c1;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x28);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  puVar7 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b8c6:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar8 = (int *)*puVar7;
  piVar4 = callback_counts;
  psVar6 = &closedir_req.bufsml[1].len;
  lVar9 = 0;
  do {
    psVar6 = psVar6 + 0x14;
    if (psVar6 == puVar7) goto LAB_0015b903;
    piVar4 = piVar4 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar9 = extraout_RDX_00;
LAB_0015b903:
  if (*piVar8 == (int)lVar9) {
    *piVar4 = *piVar4 + 1;
    free(piVar8);
    iVar1 = uv_freeaddrinfo(extraout_RDX);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar8,0);
  return iVar1;
LAB_0015b8c1:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b8c6;
}

Assistant:

TEST_IMPL(getaddrinfo_concurrent) {
  int i, r;
  int* data;

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    callback_counts[i] = 0;

    data = (int*)malloc(sizeof(int));
    ASSERT(data != NULL);
    *data = i;
    getaddrinfo_handles[i].data = data;

    r = uv_getaddrinfo(uv_default_loop(),
                       &getaddrinfo_handles[i],
                       &getaddrinfo_cuncurrent_cb,
                       name,
                       NULL,
                       NULL);
    ASSERT(r == 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    ASSERT(callback_counts[i] == 1);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}